

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smf_tempo.c
# Opt level: O3

void smf_track_add_event_pulses(smf_track_t *track,smf_event_t *event,int pulses)

{
  smf_t *smf;
  double dVar1;
  
  if (pulses < 0) {
    __assert_fail("pulses >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_tempo.c"
                  ,0x1a5,"void smf_track_add_event_pulses(smf_track_t *, smf_event_t *, int)");
  }
  if (event->time_pulses == -1) {
    if ((event->time_seconds == -1.0) && (!NAN(event->time_seconds))) {
      smf = track->smf;
      if (smf != (smf_t *)0x0) {
        event->time_pulses = pulses;
        dVar1 = seconds_from_pulses(smf,pulses);
        event->time_seconds = dVar1;
        smf_track_add_event(track,event);
        return;
      }
      __assert_fail("track->smf != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_tempo.c"
                    ,0x1a8,"void smf_track_add_event_pulses(smf_track_t *, smf_event_t *, int)");
    }
    __assert_fail("event->time_seconds == -1.0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_tempo.c"
                  ,0x1a7,"void smf_track_add_event_pulses(smf_track_t *, smf_event_t *, int)");
  }
  __assert_fail("event->time_pulses == -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_tempo.c"
                ,0x1a6,"void smf_track_add_event_pulses(smf_track_t *, smf_event_t *, int)");
}

Assistant:

void
smf_track_add_event_pulses(smf_track_t *track, smf_event_t *event, int pulses)
{
	assert(pulses >= 0);
	assert(event->time_pulses == -1);
	assert(event->time_seconds == -1.0);
	assert(track->smf != NULL);

	event->time_pulses = pulses;
	event->time_seconds = seconds_from_pulses(track->smf, pulses);
	smf_track_add_event(track, event);
}